

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.h
# Opt level: O2

void __thiscall
flatbuffers::AnnotatedBinaryTextGenerator::AnnotatedBinaryTextGenerator
          (AnnotatedBinaryTextGenerator *this,Options *options,
          map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
          *annotations,uint8_t *binary,int64_t binary_length)

{
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->annotations_)._M_t._M_impl.super__Rb_tree_header,
             &(annotations->_M_t)._M_impl.super__Rb_tree_header);
  this->binary_ = binary;
  this->binary_length_ = binary_length;
  Options::Options(&this->options_,options);
  return;
}

Assistant:

explicit AnnotatedBinaryTextGenerator(
      const Options &options, std::map<uint64_t, BinarySection> annotations,
      const uint8_t *const binary, const int64_t binary_length)
      : annotations_(std::move(annotations)),
        binary_(binary),
        binary_length_(binary_length),
        options_(options) {}